

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<float>_> **object)

{
  TPZEqnArray<std::complex<float>_> **ppTVar1;
  TPZEqnArray<std::complex<float>_> *pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TPZEqnArray<std::complex<float>_> **ppTVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int64_t i;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNElements;
  if (lVar9 != newsize) {
    lVar6 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNAlloc;
    if (lVar6 < newsize) {
      if (newsize < 0xb) {
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        else {
          ppTVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore;
          lVar6 = 0;
          do {
            this->fExtAlloc[lVar6] = ppTVar5[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        if (lVar9 < newsize) {
          do {
            this->fExtAlloc[lVar9] = *object;
            lVar9 = lVar9 + 1;
          } while (newsize != lVar9);
        }
        ppTVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore;
        if (ppTVar5 != (TPZEqnArray<std::complex<float>_> **)0x0 && ppTVar5 != this->fExtAlloc) {
          operator_delete__(ppTVar5);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore = this->fExtAlloc;
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNAlloc = 10;
      }
      else {
        dVar12 = (double)lVar6 * 1.2;
        uVar7 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar7 = newsize;
        }
        ppTVar5 = (TPZEqnArray<std::complex<float>_> **)
                  operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
        lVar6 = 0;
        if (0 < lVar9) {
          ppTVar1 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore;
          lVar8 = 0;
          do {
            ppTVar5[lVar8] = ppTVar1[lVar8];
            lVar8 = lVar8 + 1;
            lVar6 = lVar9;
          } while (lVar9 != lVar8);
        }
        auVar4 = _DAT_014f8350;
        auVar3 = _DAT_014f8340;
        lVar9 = newsize - lVar6;
        if (lVar9 != 0 && lVar6 <= newsize) {
          pTVar2 = *object;
          lVar8 = lVar9 + -1;
          auVar11._8_4_ = (int)lVar8;
          auVar11._0_8_ = lVar8;
          auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar10 = 0;
          auVar11 = auVar11 ^ _DAT_014f8350;
          do {
            auVar13._8_4_ = (int)uVar10;
            auVar13._0_8_ = uVar10;
            auVar13._12_4_ = (int)(uVar10 >> 0x20);
            auVar13 = (auVar13 | auVar3) ^ auVar4;
            if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                        auVar11._4_4_ < auVar13._4_4_) & 1)) {
              ppTVar5[lVar6 + uVar10] = pTVar2;
            }
            if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
                auVar13._12_4_ <= auVar11._12_4_) {
              ppTVar5[lVar6 + uVar10 + 1] = pTVar2;
            }
            uVar10 = uVar10 + 2;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar10);
        }
        ppTVar1 = (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore;
        if (ppTVar1 != (TPZEqnArray<std::complex<float>_> **)0x0 && ppTVar1 != this->fExtAlloc) {
          operator_delete__(ppTVar1);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore = ppTVar5;
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNAlloc = uVar7;
      }
    }
    else {
      if (lVar9 < newsize) {
        do {
          (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fStore[lVar9] = *object;
          lVar9 = lVar9 + 1;
        } while (newsize != lVar9);
      }
      (this->super_TPZVec<TPZEqnArray<std::complex<float>_>_*>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}